

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O3

bool adios2::utils::introspectAsBPFile(ifstream *f,string *name)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  undefined8 *puVar5;
  ulong uVar6;
  char *pcVar7;
  bool bVar8;
  char *pcVar9;
  string VersionTag;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  puVar5 = (undefined8 *)operator_new(0x38);
  puVar5[4] = 0;
  puVar5[5] = 0;
  puVar5[2] = 0;
  puVar5[3] = 0;
  *puVar5 = 0;
  puVar5[1] = 0;
  puVar5[6] = 0;
  std::istream::seekg((long)f,_S_beg);
  uVar6 = std::istream::tellg();
  if (0x37 < (long)uVar6) {
    std::istream::seekg((long)f,0xffffffc8);
    std::istream::read((char *)f,(long)puVar5);
    bVar8 = true;
    if (((byte)f[*(long *)(*(long *)f + -0x18) + 0x20] & 5) != 0) goto LAB_00114933;
    bVar1 = *(byte *)((long)puVar5 + 0x34);
    if (bVar1 < 2) {
      bVar8 = false;
      if ((3 < *(byte *)((long)puVar5 + 0x36)) || (*(byte *)((long)puVar5 + 0x36) == 1))
      goto LAB_00114933;
      bVar2 = *(byte *)((long)puVar5 + 0x37);
      if (0xfc < (byte)(bVar2 - 4)) {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,puVar5,(long)puVar5 + 0x1c);
        if ((bVar1 == 1) ||
           (((*(ulong *)((long)puVar5 + 0x2c) < uVar6 &&
             (*(ulong *)((long)puVar5 + 0x1c) < *(ulong *)((long)puVar5 + 0x24))) &&
            (*(ulong *)((long)puVar5 + 0x24) < *(ulong *)((long)puVar5 + 0x2c))))) {
          if (bVar2 < 3) {
            printf("ADIOS-BP Version %d\n",(ulong)(uint)(int)(char)bVar2);
          }
          else {
            bVar2 = *(byte *)(puVar5 + 3);
            bVar3 = *(byte *)((long)puVar5 + 0x1a);
            bVar4 = *(byte *)((long)puVar5 + 0x19) - 0x30;
            if (bVar2 < 0x31) {
              bVar4 = *(byte *)((long)puVar5 + 0x19);
            }
            pcVar7 = local_50[0] + 10;
            do {
              pcVar9 = pcVar7;
              pcVar7 = pcVar9 + 1;
            } while ((byte)(*pcVar9 - 0x30U) < 10 || *pcVar9 == '.');
            if (0x30 < bVar2) {
              bVar3 = bVar3 - 0x30;
              bVar2 = bVar2 - 0x30;
            }
            *pcVar9 = '\0';
            pcVar7 = "Little Endian";
            if (bVar1 == 1) {
              pcVar7 = "Big Endian";
            }
            printf("ADIOS-BP Version %d %s - ADIOS v%d.%d.%d\n",3,pcVar7,(ulong)bVar2,(ulong)bVar4,
                   (ulong)bVar3);
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0]);
          }
          bVar8 = true;
          goto LAB_00114933;
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
      }
    }
  }
  bVar8 = false;
LAB_00114933:
  operator_delete(puVar5);
  return bVar8;
}

Assistant:

bool introspectAsBPFile(std::ifstream &f, const std::string &name) noexcept
{
    const int MFOOTERSIZE = 56;
    std::vector<char> buffer(MFOOTERSIZE, 0);
    f.seekg(0, f.end);
    auto flength = f.tellg();
    if (flength < MFOOTERSIZE)
    {
        return false;
    }
    f.seekg(-MFOOTERSIZE, f.end);
    f.read(buffer.data(), MFOOTERSIZE);
    if (f)
    {
        const uint8_t endianness = static_cast<uint8_t>(buffer[52]);
        if (endianness > 1)
        {
            return false;
        }
        bool IsBigEndian = (endianness == 1) ? true : false;

        const int8_t fileType = static_cast<int8_t>(buffer[54]);
        if (fileType != 0 && fileType != 2 && fileType != 3)
        {
            return false;
        }
        const int8_t BPVersion = static_cast<uint8_t>(buffer[55]);
        if (BPVersion < 1 || BPVersion > 3)
        {
            return false;
        }

        size_t position = 0;
        std::string VersionTag(buffer.data(), 28);
        position = 28;

        if (!IsBigEndian)
        {
            uint64_t PGIndexStart = helper::ReadValue<uint64_t>(buffer, position, !IsBigEndian);
            uint64_t VarsIndexStart = helper::ReadValue<uint64_t>(buffer, position, !IsBigEndian);
            uint64_t AttributesIndexStart =
                helper::ReadValue<uint64_t>(buffer, position, !IsBigEndian);
            if (PGIndexStart >= VarsIndexStart || VarsIndexStart >= AttributesIndexStart ||
                AttributesIndexStart >= static_cast<uint64_t>(flength))
            {
                return false;
            }
        }

        if (BPVersion < 3)
        {
            printf("ADIOS-BP Version %d\n", BPVersion);
        }
        else
        {
            uint8_t major = static_cast<uint8_t>(buffer[24]);
            uint8_t minor = static_cast<uint8_t>(buffer[25]);
            uint8_t patch = static_cast<uint8_t>(buffer[26]);
            if (major > '0')
            {
                // ADIOS2 writes these as ASCII characters
                major -= '0';
                minor -= '0';
                patch -= '0';
            }

            /* Cleanup ADIOS2 bug here: VersionTag is not filled with 0s */
            int pos = 10;
            while (VersionTag[pos] == '.' || (VersionTag[pos] >= '0' && VersionTag[pos] <= '9'))
            {
                ++pos;
            }
            VersionTag[pos] = '\0';
            printf("ADIOS-BP Version %d %s - ADIOS v%d.%d.%d\n", BPVersion,
                   (IsBigEndian ? "Big Endian" : "Little Endian"), major, minor, patch);
        }
    }
    return true;
}